

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_ksx1001_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  zueci_u32 u2;
  int ind;
  uchar c2;
  uchar c1;
  zueci_u32 *p_u_local;
  uint flags_local;
  zueci_u32 len_local;
  uchar *src_local;
  int local_4;
  
  bVar1 = *src;
  if (bVar1 < 0x80) {
    *p_u = (uint)bVar1;
    local_4 = 1;
  }
  else if ((((len < 2) || (bVar1 < 0xa1)) || ((0xac < bVar1 && (bVar1 < 0xb0)))) ||
          ((bVar1 == 0xc9 || (0xfd < bVar1)))) {
    local_4 = 0;
  }
  else {
    bVar2 = src[1];
    if ((bVar2 < 0xa1) || (bVar2 == 0xff)) {
      local_4 = 0;
    }
    else if (zueci_ksx1001_mb_u
             [(int)((((bVar1 - 0xa1) + (uint)(0xac < bVar1) * -3) - (uint)(0xc9 < bVar1)) * 0x5e +
                    (uint)bVar2 + -0xa1)] == 0) {
      local_4 = 0;
    }
    else {
      *p_u = (uint)zueci_ksx1001_mb_u
                   [(int)((((bVar1 - 0xa1) + (uint)(0xac < bVar1) * -3) - (uint)(0xc9 < bVar1)) *
                          0x5e + (uint)bVar2 + -0xa1)];
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static int zueci_ksx1001_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0xA1 || (c1 > 0xAC && c1 < 0xB0) || c1 == 0xC9 || c1 > 0xFD) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0xA1 || c2 == 0xFF) {
        return 0;
    }
    ind = (0xFF - 0xA1) * (c1 - 0xA1 - (c1 > 0xAC) * 3 - (c1 > 0xC9)) + c2 - 0xA1;
    assert(ind < ZUECI_ASIZE(zueci_ksx1001_mb_u));
    if ((u2 = zueci_ksx1001_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}